

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationTest.cpp
# Opt level: O2

void __thiscall TestReadConfigurationFile_Aliases::Run(TestReadConfigurationFile_Aliases *this)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  ostream *poVar2;
  size_type sVar3;
  runtime_error *prVar4;
  size_t in_RCX;
  void *__buf;
  allocator local_3c1;
  key_type local_3c0;
  Configuration config;
  stringstream ss;
  ostream local_188;
  
  std::__cxx11::string::string
            ((string *)&config,"config-cpp-dependencies.txt",(allocator *)&local_3c0);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&config,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&config);
  poVar2 = std::operator<<(&local_188,"addLibraryAlias: [\n");
  poVar2 = std::operator<<(poVar2,"      add_special_library  \n");
  poVar2 = std::operator<<(poVar2,"      add_test_lib\n");
  poVar2 = std::operator<<(poVar2,"     ]\n");
  poVar2 = std::operator<<(poVar2,"addExecutableAlias: [\n");
  poVar2 = std::operator<<(poVar2,"         add_special_exe\n");
  poVar2 = std::operator<<(poVar2,"add_test\n");
  std::operator<<(poVar2,"]\n");
  Configuration::Configuration(&config);
  Configuration::read(&config,(int)&ss,__buf,in_RCX);
  if (config.addLibraryAliases._M_h._M_element_count != 3) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addLibraryAliases.size() == 3");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_3c0,"add_library",&local_3c1);
  puVar1 = &config.addLibraryAliases;
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&puVar1->_M_h,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (sVar3 != 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addLibraryAliases.count(\"add_library\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_3c0,"add_special_library",&local_3c1);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&puVar1->_M_h,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (sVar3 != 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,
               "Assertion failed: config.addLibraryAliases.count(\"add_special_library\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_3c0,"add_test_lib",&local_3c1);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&puVar1->_M_h,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (sVar3 != 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addLibraryAliases.count(\"add_test_lib\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (config.addExecutableAliases._M_h._M_element_count != 3) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addExecutableAliases.size() == 3");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_3c0,"add_executable",&local_3c1);
  puVar1 = &config.addExecutableAliases;
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&puVar1->_M_h,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (sVar3 != 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addExecutableAliases.count(\"add_executable\") == 1"
              );
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_3c0,"add_special_exe",&local_3c1);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&puVar1->_M_h,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (sVar3 != 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,
               "Assertion failed: config.addExecutableAliases.count(\"add_special_exe\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_3c0,"add_test",&local_3c1);
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&puVar1->_M_h,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (sVar3 == 1) {
    Configuration::~Configuration(&config);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar4,"Assertion failed: config.addExecutableAliases.count(\"add_test\") == 1");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(ReadConfigurationFile_Aliases)
{
  std::stringstream ss(CONFIG_FILE);
  ss << "addLibraryAlias: [\n"
     << "      add_special_library  \n"
     << "      add_test_lib\n"
     << "     ]\n"
     << "addExecutableAlias: [\n"
     << "         add_special_exe\n"
     << "add_test\n"
     << "]\n";

  Configuration config;
  config.read(ss);
  ASSERT(config.addLibraryAliases.size() == 3);
  ASSERT(config.addLibraryAliases.count("add_library") == 1);
  ASSERT(config.addLibraryAliases.count("add_special_library") == 1);
  ASSERT(config.addLibraryAliases.count("add_test_lib") == 1);

  ASSERT(config.addExecutableAliases.size() == 3);
  ASSERT(config.addExecutableAliases.count("add_executable") == 1);
  ASSERT(config.addExecutableAliases.count("add_special_exe") == 1);
  ASSERT(config.addExecutableAliases.count("add_test") == 1);
}